

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  time_t tVar1;
  Curl_tree *pCVar2;
  curltime i;
  curltime now_00;
  curltime cVar3;
  undefined1 local_f0 [8];
  sigpipe_ignore pipe_st;
  CURLMcode result;
  curltime now;
  Curl_tree *t;
  Curl_easy *pCStack_28;
  CURLMcode returncode;
  Curl_easy *data;
  int *running_handles_local;
  Curl_multi *multi_local;
  
  t._4_4_ = CURLM_OK;
  cVar3 = Curl_now();
  tVar1 = cVar3.tv_sec;
  now.tv_sec._0_4_ = cVar3.tv_usec;
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((multi->in_callback & 1U) == 0) {
    for (pCStack_28 = multi->easyp; pCStack_28 != (Curl_easy *)0x0; pCStack_28 = pCStack_28->next) {
      sigpipe_ignore(pCStack_28,(sigpipe_ignore *)local_f0);
      cVar3.tv_usec = (int)now.tv_sec;
      cVar3.tv_sec = tVar1;
      cVar3._12_4_ = 0;
      pipe_st._156_4_ = multi_runsingle(multi,cVar3,pCStack_28);
      sigpipe_restore((sigpipe_ignore *)local_f0);
      if (pipe_st._156_4_ != 0) {
        t._4_4_ = pipe_st._156_4_;
      }
    }
    do {
      i.tv_usec = (int)now.tv_sec;
      i.tv_sec = tVar1;
      i._12_4_ = 0;
      pCVar2 = Curl_splaygetbest(i,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar2;
      if (now._8_8_ != 0) {
        now_00.tv_usec = (int)now.tv_sec;
        now_00.tv_sec = tVar1;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,*(Curl_easy **)(now._8_8_ + 0x30));
      }
    } while (now._8_8_ != 0);
    *running_handles = multi->num_alive;
    if (t._4_4_ < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
    multi_local._4_4_ = t._4_4_;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    update_timer(multi);

  return returncode;
}